

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfuda_cache.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *__return_storage_ptr__,
      lfuda_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      *this,unsigned_long *key,bool peek)

{
  time_point now;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::mutex::lock((mutex *)this);
  do_find(__return_storage_ptr__,this,key,peek,now);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

auto find(const key_type& key, bool peek = false) -> std::optional<value_type>
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};
        return do_find(key, peek, now);
    }